

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O0

int jas_stream_printf(jas_stream_t *stream,char *fmt,...)

{
  int iVar1;
  char local_1038 [4];
  int ret;
  char buf [4096];
  va_list ap;
  char *fmt_local;
  jas_stream_t *stream_local;
  
  buf[0xffc] = '0';
  buf[0xffd] = '\0';
  buf[0xffe] = '\0';
  buf[0xfff] = '\0';
  buf[0xff8] = '\x10';
  buf[0xff9] = '\0';
  buf[0xffa] = '\0';
  buf[0xffb] = '\0';
  iVar1 = vsnprintf(local_1038,0x1000,fmt,buf + 0xff8);
  jas_stream_puts(stream,local_1038);
  return iVar1;
}

Assistant:

int jas_stream_printf(jas_stream_t *stream, const char *fmt, ...)
{
	va_list ap;
	char buf[4096];
	int ret;

	va_start(ap, fmt);
	ret = vsnprintf(buf, sizeof buf, fmt, ap);
	jas_stream_puts(stream, buf);
	va_end(ap);
	return ret;
}